

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collision.cpp
# Opt level: O1

void __thiscall CCollision::Init(CCollision *this,CLayers *pLayers)

{
  byte bVar1;
  int iVar2;
  undefined4 extraout_var;
  uint uVar4;
  ulong uVar5;
  uchar uVar6;
  CTile *pCVar3;
  
  this->m_pLayers = pLayers;
  iVar2 = pLayers->m_pGameLayer->m_Height;
  this->m_Width = pLayers->m_pGameLayer->m_Width;
  this->m_Height = iVar2;
  iVar2 = (*(pLayers->m_pMap->super_IInterface)._vptr_IInterface[2])();
  pCVar3 = (CTile *)CONCAT44(extraout_var,iVar2);
  this->m_pTiles = pCVar3;
  uVar4 = this->m_Height * this->m_Width;
  if (0 < (int)uVar4) {
    uVar5 = 0;
    do {
      bVar1 = pCVar3[uVar5].m_Index;
      if (bVar1 < 0x81) {
        uVar6 = (uchar)(0x5020100 >> ((bVar1 & 3) << 3));
        if (3 < bVar1) {
          uVar6 = '\0';
        }
        pCVar3[uVar5].m_Index = uVar6;
      }
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  return;
}

Assistant:

void CCollision::Init(class CLayers *pLayers)
{
	m_pLayers = pLayers;
	m_Width = m_pLayers->GameLayer()->m_Width;
	m_Height = m_pLayers->GameLayer()->m_Height;
	m_pTiles = static_cast<CTile *>(m_pLayers->Map()->GetData(m_pLayers->GameLayer()->m_Data));

	for(int i = 0; i < m_Width*m_Height; i++)
	{
		int Index = m_pTiles[i].m_Index;

		if(Index > 128)
			continue;

		switch(Index)
		{
		case TILE_DEATH:
			m_pTiles[i].m_Index = COLFLAG_DEATH;
			break;
		case TILE_SOLID:
			m_pTiles[i].m_Index = COLFLAG_SOLID;
			break;
		case TILE_NOHOOK:
			m_pTiles[i].m_Index = COLFLAG_SOLID|COLFLAG_NOHOOK;
			break;
		default:
			m_pTiles[i].m_Index = 0;
		}
	}
}